

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCodeVector(Parse *pParse,Expr *p,int *piFreeable)

{
  int iVar1;
  int iVar2;
  Expr *in_RDX;
  Parse *in_RSI;
  long in_RDI;
  int i;
  int nResult;
  int iResult;
  Parse *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 uVar4;
  
  uVar4 = 0xaaaaaaaa;
  iVar1 = sqlite3ExprVectorSize((Expr *)in_RSI);
  if (iVar1 == 1) {
    iVar2 = sqlite3ExprCodeTemp(in_RSI,in_RDX,(int *)CONCAT44(uVar4,1));
  }
  else {
    in_RDX->op = '\0';
    in_RDX->affExpr = '\0';
    in_RDX->op2 = '\0';
    in_RDX->field_0x3 = 0;
    if (*(char *)&in_RSI->db == -0x75) {
      iVar2 = sqlite3CodeSubselect(in_stack_00000028,(Expr *)pParse);
    }
    else {
      iVar2 = *(int *)(in_RDI + 0x3c) + 1;
      *(int *)(in_RDI + 0x3c) = iVar1 + *(int *)(in_RDI + 0x3c);
      for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
        sqlite3ExprCodeFactorable
                  ((Parse *)CONCAT44(iVar2,iVar1),(Expr *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                   0);
      }
    }
  }
  return iVar2;
}

Assistant:

static int exprCodeVector(Parse *pParse, Expr *p, int *piFreeable){
  int iResult;
  int nResult = sqlite3ExprVectorSize(p);
  if( nResult==1 ){
    iResult = sqlite3ExprCodeTemp(pParse, p, piFreeable);
  }else{
    *piFreeable = 0;
    if( p->op==TK_SELECT ){
#if SQLITE_OMIT_SUBQUERY
      iResult = 0;
#else
      iResult = sqlite3CodeSubselect(pParse, p);
#endif
    }else{
      int i;
      iResult = pParse->nMem+1;
      pParse->nMem += nResult;
      assert( ExprUseXList(p) );
      for(i=0; i<nResult; i++){
        sqlite3ExprCodeFactorable(pParse, p->x.pList->a[i].pExpr, i+iResult);
      }
    }
  }
  return iResult;
}